

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O2

int tool_progress_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
                    curl_off_t ulnow)

{
  ProgressData *bar;
  uint uVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [12];
  uint uVar5;
  long lVar6;
  timediff_t tVar7;
  ulong uVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  size_t __n;
  double dVar13;
  curltime cVar14;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  char format [40];
  char line [401];
  
  cVar14 = curlx_now();
  lVar2 = *(long *)((long)clientp + 0xb8);
  bar = (ProgressData *)((long)clientp + 0x88);
  if (lVar2 < 0) {
    lVar12 = ultotal + dltotal;
    lVar6 = ulnow + dlnow;
    if (ultotal == 0 && dltotal == 0) {
      lVar12 = 0x7fffffffffffffff;
      lVar6 = 0x7fffffffffffffff;
    }
  }
  else {
    lVar12 = lVar2 + ultotal + dltotal;
    if (0x7fffffffffffffff - lVar2 < ultotal + dltotal) {
      lVar12 = 0x7fffffffffffffff;
    }
    lVar6 = lVar2 + ulnow + dlnow;
    if (0x7fffffffffffffff - lVar2 < ulnow + dlnow) {
      lVar6 = 0x7fffffffffffffff;
    }
  }
  lVar2 = *(long *)((long)clientp + 0x10);
  if (bar->calls != 0) {
    auVar4 = cVar14._0_12_;
    if (lVar12 == 0) {
      newer_00._12_4_ = 0;
      newer_00.tv_sec = auVar4._0_8_;
      newer_00.tv_usec = auVar4._8_4_;
      older_00._12_4_ = 0;
      older_00._0_12_ = *(undefined1 (*) [12])((long)clientp + 0x98);
      tVar7 = curlx_timediff(newer_00,older_00);
      if (tVar7 < 100) {
        return 0;
      }
      update_width(bar);
      lVar3 = *(long *)((long)clientp + 0x90);
      iVar10 = *(int *)((long)clientp + 0xa8);
      line[0] = '\r';
      memset(line + 1,0x20,(long)iVar10);
      line[(long)iVar10 + 1] = '\0';
      builtin_strncpy(line + (long)*(int *)((long)clientp + 0xc4) + 1,"-=O=-",5);
      uVar1 = *(uint *)((long)clientp + 0xc0);
      iVar11 = 0;
      iVar10 = (int)(1000000 / (long)(iVar10 + -2));
      line[(long)(sinus[(ulong)uVar1 % 200] / iVar10) + 1] = '#';
      line[(long)(sinus[(ulong)(uVar1 + 5) % 200] / iVar10) + 1] = '#';
      line[(long)(sinus[(ulong)(uVar1 + 10) % 200] / iVar10) + 1] = '#';
      line[(long)(sinus[(ulong)(uVar1 + 0xf) % 200] / iVar10) + 1] = '#';
      fputs(line,*(FILE **)((long)clientp + 0xb0));
      uVar1 = *(int *)((long)clientp + 0xc0) + 2;
      uVar5 = *(int *)((long)clientp + 0xc0) - 0xc6;
      if (uVar1 < 200) {
        uVar5 = uVar1;
      }
      *(uint *)((long)clientp + 0xc0) = uVar5;
      if (lVar6 != lVar3) {
        iVar11 = *(int *)((long)clientp + 200);
      }
      iVar11 = iVar11 + *(int *)((long)clientp + 0xc4);
      *(int *)((long)clientp + 0xc4) = iVar11;
      iVar10 = *(int *)((long)clientp + 0xa8) + -6;
      if (iVar11 < iVar10) {
        if (-1 < iVar11) goto LAB_0010bce7;
        iVar10 = 0;
        uVar9 = 1;
      }
      else {
        uVar9 = 0xffffffff;
      }
      *(undefined4 *)((long)clientp + 200) = uVar9;
      *(int *)((long)clientp + 0xc4) = iVar10;
    }
    else {
      if (*(long *)((long)clientp + 0x90) == lVar6) {
        return 0;
      }
      newer._12_4_ = 0;
      newer.tv_sec = auVar4._0_8_;
      newer.tv_usec = auVar4._8_4_;
      older._12_4_ = 0;
      older._0_12_ = *(undefined1 (*) [12])((long)clientp + 0x98);
      tVar7 = curlx_timediff(newer,older);
      if ((tVar7 < 100) && (lVar6 < lVar12)) {
        return 0;
      }
    }
  }
LAB_0010bce7:
  bar->calls = bar->calls + 1;
  update_width(bar);
  if ((0 < lVar12) && (lVar6 != *(long *)((long)clientp + 0x90))) {
    if (lVar12 < lVar6) {
      lVar12 = lVar6;
    }
    iVar10 = *(int *)((long)clientp + 0xa8) + -7;
    dVar13 = (double)iVar10 * ((double)lVar6 / (double)lVar12);
    uVar8 = (ulong)dVar13;
    __n = (long)(dVar13 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
    if (399 < __n) {
      __n = 400;
    }
    memset(line,0x23,__n);
    line[__n] = '\0';
    curl_msnprintf(format,0x28,"\r%%-%ds %%5.1f%%%%",iVar10);
    curl_mfprintf(((double)lVar6 / (double)lVar12) * 100.0,*(undefined8 *)((long)clientp + 0xb0),
                  format,line);
  }
  fflush(*(FILE **)((long)clientp + 0xb0));
  *(long *)((long)clientp + 0x90) = lVar6;
  *(time_t *)((long)clientp + 0x98) = cVar14.tv_sec;
  *(int *)((long)clientp + 0xa0) = cVar14.tv_usec;
  uVar8 = *(ulong *)(lVar2 + 0x4e4);
  if (((uint)uVar8 >> 0x1d & 1) != 0) {
    *(ulong *)(lVar2 + 0x4e4) = uVar8 & 0xffffffffdfffffff;
    curl_easy_pause(*(undefined8 *)((long)clientp + 0x20),0);
  }
  return 0;
}

Assistant:

int tool_progress_cb(void *clientp,
                     curl_off_t dltotal, curl_off_t dlnow,
                     curl_off_t ultotal, curl_off_t ulnow)
{
  struct curltime now = curlx_now();
  struct per_transfer *per = clientp;
  struct OperationConfig *config = per->config;
  struct ProgressData *bar = &per->progressbar;
  curl_off_t total;
  curl_off_t point;

  /* Calculate expected transfer size. initial_size can be less than zero when
     indicating that we are expecting to get the filesize from the remote */
  if(bar->initial_size < 0) {
    if(dltotal || ultotal)
      total = dltotal + ultotal;
    else
      total = CURL_OFF_T_MAX;
  }
  else if((CURL_OFF_T_MAX - bar->initial_size) < (dltotal + ultotal))
    total = CURL_OFF_T_MAX;
  else
    total = dltotal + ultotal + bar->initial_size;

  /* Calculate the current progress. initial_size can be less than zero when
     indicating that we are expecting to get the filesize from the remote */
  if(bar->initial_size < 0) {
    if(dltotal || ultotal)
      point = dlnow + ulnow;
    else
      point = CURL_OFF_T_MAX;
  }
  else if((CURL_OFF_T_MAX - bar->initial_size) < (dlnow + ulnow))
    point = CURL_OFF_T_MAX;
  else
    point = dlnow + ulnow + bar->initial_size;

  if(bar->calls) {
    /* after first call... */
    if(total) {
      /* we know the total data to get... */
      if(bar->prev == point)
        /* progress did not change since last invoke */
        return 0;
      else if((curlx_timediff(now, bar->prevtime) < 100L) && point < total)
        /* limit progress-bar updating to 10 Hz except when we are at 100% */
        return 0;
    }
    else {
      /* total is unknown */
      if(curlx_timediff(now, bar->prevtime) < 100L)
        /* limit progress-bar updating to 10 Hz */
        return 0;
      update_width(bar);
      fly(bar, point != bar->prev);
    }
  }

  /* simply count invokes */
  bar->calls++;

  update_width(bar);
  if((total > 0) && (point != bar->prev)) {
    char line[MAX_BARLENGTH + 1];
    char format[40];
    double frac;
    double percent;
    int barwidth;
    size_t num;
    if(point > total)
      /* we have got more than the expected total! */
      total = point;

    frac = (double)point / (double)total;
    percent = frac * 100.0;
    barwidth = bar->width - 7;
    num = (size_t) (((double)barwidth) * frac);
    if(num > MAX_BARLENGTH)
      num = MAX_BARLENGTH;
    memset(line, '#', num);
    line[num] = '\0';
    msnprintf(format, sizeof(format), "\r%%-%ds %%5.1f%%%%", barwidth);
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
    fprintf(bar->out, format, line, percent);
#ifdef __clang__
#pragma clang diagnostic pop
#endif
  }
  fflush(bar->out);
  bar->prev = point;
  bar->prevtime = now;

  if(config->readbusy) {
    config->readbusy = FALSE;
    curl_easy_pause(per->curl, CURLPAUSE_CONT);
  }

  return 0;
}